

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMfs.c
# Opt level: O1

Gia_Man_t * Gia_ManPerformMfs(Gia_Man_t *p,Sfm_Par_t *pPars)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  uint uVar3;
  Sfm_Ntk_t *p_00;
  Gia_Man_t *pGVar4;
  Vec_Int_t *pVVar5;
  int *__dest;
  char *format;
  Sfm_Ntk_t *pSVar6;
  long lVar7;
  
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                  ,0x1f5,"Gia_Man_t *Gia_ManPerformMfs(Gia_Man_t *, Sfm_Par_t *)");
  }
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("p->vMapping != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                  ,0x1f6,"Gia_Man_t *Gia_ManPerformMfs(Gia_Man_t *, Sfm_Par_t *)");
  }
  if (p->pManTime != (void *)0x0) {
    if (p->pAigExtra == (Gia_Man_t *)0x0) {
      format = "Timing manager is given but there is no GIA of boxes.\n";
      goto LAB_007757c9;
    }
    if (((p->pManTime != (void *)0x0) && (p->pAigExtra != (Gia_Man_t *)0x0)) &&
       (0xf < p->pAigExtra->vCis->nSize)) {
      format = 
      "Currently \"&mfs\" cannot process the network containing white-boxes with more than 15 inputs.\n"
      ;
      goto LAB_007757c9;
    }
  }
  pGVar4 = p;
  iVar2 = Gia_ManLutSizeMax(p);
  if (iVar2 < 0x10) {
    p_00 = Gia_ManExtractMfs(p);
    pSVar6 = p_00;
    uVar3 = Sfm_NtkPerform(p_00,pPars);
    if (uVar3 == 0) {
      if (p->pManTime != (void *)0x0) {
        Abc_Print((int)pSVar6,"The network is not changed by \"&mfs\".\n");
      }
      pGVar4 = Gia_ManDup(p);
      pVVar1 = p->vMapping;
      pVVar5 = (Vec_Int_t *)malloc(0x10);
      iVar2 = pVVar1->nSize;
      lVar7 = (long)iVar2;
      pVVar5->nSize = iVar2;
      pVVar5->nCap = iVar2;
      if (lVar7 == 0) {
        __dest = (int *)0x0;
      }
      else {
        __dest = (int *)malloc(lVar7 * 4);
      }
      pVVar5->pArray = __dest;
      memcpy(__dest,pVVar1->pArray,lVar7 << 2);
      pGVar4->vMapping = pVVar5;
      Gia_ManTransferTiming(pGVar4,p);
    }
    else {
      pGVar4 = Gia_ManInsertMfs(p,p_00,pPars->fAllBoxes);
      if (pPars->fVerbose != 0) {
        Abc_Print((int)p,"The network has %d nodes changed by \"&mfs\".\n",(ulong)uVar3);
      }
    }
    Sfm_NtkFree(p_00);
    return pGVar4;
  }
  format = 
  "Currently \"&mfs\" cannot process the network containing nodes with more than 15 fanins.\n";
  p = pGVar4;
LAB_007757c9:
  Abc_Print((int)p,format);
  return (Gia_Man_t *)0x0;
}

Assistant:

Gia_Man_t * Gia_ManPerformMfs( Gia_Man_t * p, Sfm_Par_t * pPars )
{
    Sfm_Ntk_t * pNtk;
    Gia_Man_t * pNew;
    int nFaninMax, nNodes;
    assert( Gia_ManRegNum(p) == 0 );
    assert( p->vMapping != NULL );
    if ( p->pManTime != NULL && p->pAigExtra == NULL )
    {
        Abc_Print( 1, "Timing manager is given but there is no GIA of boxes.\n" );
        return NULL;
    }
    if ( p->pManTime != NULL && p->pAigExtra != NULL && Gia_ManCiNum(p->pAigExtra) > 15 )
    {
        Abc_Print( 1, "Currently \"&mfs\" cannot process the network containing white-boxes with more than 15 inputs.\n" );
        return NULL;
    }
    // count fanouts
    nFaninMax = Gia_ManLutSizeMax( p );
    if ( nFaninMax > 15 )
    {
        Abc_Print( 1, "Currently \"&mfs\" cannot process the network containing nodes with more than 15 fanins.\n" );
        return NULL;
    }
    // collect information
    pNtk = Gia_ManExtractMfs( p );
    // perform optimization
    nNodes = Sfm_NtkPerform( pNtk, pPars );
    if ( nNodes == 0 )
    {
        if ( p->pManTime )
        Abc_Print( 1, "The network is not changed by \"&mfs\".\n" );
        pNew = Gia_ManDup( p );
        pNew->vMapping = Vec_IntDup( p->vMapping );
        Gia_ManTransferTiming( pNew, p );
    }
    else
    {
        pNew = Gia_ManInsertMfs( p, pNtk, pPars->fAllBoxes );
        if( pPars->fVerbose )
            Abc_Print( 1, "The network has %d nodes changed by \"&mfs\".\n", nNodes );
        // check integrity
        //Gia_ManCheckIntegrityWithBoxes( pNew );
    }
    Sfm_NtkFree( pNtk );
    return pNew;
}